

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2pDrawCallBatchingTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::gles2::Performance::anon_unknown_0::DrawCallBatchingTest::iterate(DrawCallBatchingTest *this)

{
  int iVar1;
  TestContext *this_00;
  size_type sVar2;
  size_type sVar3;
  TestLog *log_00;
  char *pcVar4;
  MessageBuilder *pMVar5;
  int *piVar6;
  int precision;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  int local_c40;
  int local_c3c;
  double local_c38;
  double x_1;
  double local_c28;
  double x;
  MessageBuilder local_aa0;
  int local_91c;
  string local_918;
  double local_8f8;
  MessageBuilder local_8f0;
  MessageBuilder local_770;
  MessageBuilder local_5f0;
  double local_470;
  size_type local_468;
  MessageBuilder local_460;
  double local_2e0;
  size_type local_2d8;
  MessageBuilder local_2d0;
  undefined1 local_150 [8];
  Statistics batchedStats;
  Statistics unbatchedStats;
  double limitSEM;
  double targetSEM;
  string local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  string local_c8;
  allocator<char> local_a5 [13];
  string local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  string local_58;
  ScopedLogSection local_38;
  ScopedLogSection section;
  TestLog *log;
  deUint64 local_20;
  DrawCallBatchingTest *local_18;
  DrawCallBatchingTest *this_local;
  
  local_18 = this;
  if (this->m_state == STATE_LOG_INFO) {
    logTestInfo(this);
    this->m_state = STATE_WARMUP_BATCHED;
  }
  else if (this->m_state == STATE_WARMUP_BATCHED) {
    renderBatched(this);
    this->m_state = STATE_WARMUP_UNBATCHED;
  }
  else if (this->m_state == STATE_WARMUP_UNBATCHED) {
    renderUnbatched(this);
    this->m_state = STATE_SAMPLE;
  }
  else if (this->m_state == STATE_SAMPLE) {
    sVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                      (&this->m_unbatchedSamplesUs);
    if ((int)sVar2 < this->m_unbatchedSampleCount) {
      sVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                        (&this->m_unbatchedSamplesUs);
      auVar7._8_4_ = (int)(sVar2 >> 0x20);
      auVar7._0_8_ = sVar2;
      auVar7._12_4_ = 0x45300000;
      iVar1 = this->m_unbatchedSampleCount;
      sVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                        (&this->m_batchedSamplesUs);
      auVar8._8_4_ = (int)(sVar3 >> 0x20);
      auVar8._0_8_ = sVar3;
      auVar8._12_4_ = 0x45300000;
      if ((((auVar7._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)sVar2) - 4503599627370496.0)) / (double)iVar1 <
           ((auVar8._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)sVar3) - 4503599627370496.0)) /
           (double)this->m_batchedSampleCount) ||
         (sVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                            (&this->m_batchedSamplesUs), this->m_batchedSampleCount <= (int)sVar2))
      {
        local_20 = renderUnbatched(this);
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                  (&this->m_unbatchedSamplesUs,&local_20);
        return CONTINUE;
      }
    }
    sVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                      (&this->m_batchedSamplesUs);
    if ((int)sVar2 < this->m_batchedSampleCount) {
      log = (TestLog *)renderBatched(this);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                (&this->m_batchedSamplesUs,(value_type_conflict9 *)&log);
    }
    else {
      this->m_state = STATE_CALC_CALIBRATION;
    }
  }
  else if (this->m_state == STATE_CALC_CALIBRATION) {
    log_00 = tcu::TestContext::getLog((this->super_TestCase).super_TestNode.m_testCtx);
    section.m_log = log_00;
    de::toString<int>(&local_98,&this->m_sampleIteration);
    std::operator+(&local_78,"Sampling iteration ",&local_98);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,pcVar4,local_a5);
    de::toString<int>(&local_108,&this->m_sampleIteration);
    std::operator+(&local_e8,"Sampling iteration ",&local_108);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c8,pcVar4,(allocator<char> *)((long)&targetSEM + 7));
    tcu::ScopedLogSection::ScopedLogSection(&local_38,log_00,&local_58,&local_c8);
    std::__cxx11::string::~string((string *)&local_c8);
    std::allocator<char>::~allocator((allocator<char> *)((long)&targetSEM + 7));
    std::__cxx11::string::~string((string *)&local_e8);
    std::__cxx11::string::~string((string *)&local_108);
    std::__cxx11::string::~string((string *)&local_58);
    std::allocator<char>::~allocator(local_a5);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&local_98);
    unbatchedStats.standardErrorOfMean = 0.025;
    calculateStats((Statistics *)&batchedStats.standardErrorOfMean,&this->m_unbatchedSamplesUs);
    calculateStats((Statistics *)local_150,&this->m_batchedSamplesUs);
    tcu::TestLog::operator<<(&local_2d0,section.m_log,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar5 = tcu::MessageBuilder::operator<<(&local_2d0,(char (*) [25])"Batched samples; Count: ");
    local_2d8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                          (&this->m_batchedSamplesUs);
    pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&local_2d8);
    pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [9])", Mean: ");
    pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(double *)local_150);
    pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [25])"us, Standard deviation: ");
    pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&batchedStats.mean);
    pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [29])"us, Standard error of mean: ");
    pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&batchedStats.standardDeviation);
    pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [4])0x2c7665a);
    local_2e0 = batchedStats.standardDeviation / (double)local_150;
    pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&local_2e0);
    pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [2])0x2a94734);
    tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_2d0);
    tcu::TestLog::operator<<(&local_460,section.m_log,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar5 = tcu::MessageBuilder::operator<<(&local_460,(char (*) [27])"Unbatched samples; Count: ")
    ;
    local_468 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                          (&this->m_unbatchedSamplesUs);
    pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&local_468);
    pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [9])", Mean: ");
    pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&batchedStats.standardErrorOfMean);
    pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [25])"us, Standard deviation: ");
    pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&unbatchedStats.mean);
    pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [29])"us, Standard error of mean: ");
    pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&unbatchedStats.standardDeviation);
    pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [4])0x2c7665a);
    local_470 = unbatchedStats.standardDeviation / batchedStats.standardErrorOfMean;
    pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&local_470);
    pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [2])0x2a94734);
    tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_460);
    if ((2 < this->m_sampleIteration) ||
       ((0 < this->m_sampleIteration &&
        (unbatchedStats.standardDeviation / batchedStats.standardErrorOfMean +
         batchedStats.standardDeviation / (double)local_150 <= 0.05)))) {
      if (2 < this->m_sampleIteration) {
        tcu::TestLog::operator<<
                  (&local_5f0,section.m_log,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar5 = tcu::MessageBuilder::operator<<
                           (&local_5f0,(char (*) [33])"Maximum iteration count reached.");
        tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_5f0);
      }
      tcu::TestLog::operator<<(&local_770,section.m_log,(BeginMessageToken *)&tcu::TestLog::Message)
      ;
      pMVar5 = tcu::MessageBuilder::operator<<
                         (&local_770,(char (*) [33])"Standard errors in target range.");
      tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_770);
      tcu::TestLog::operator<<(&local_8f0,section.m_log,(BeginMessageToken *)&tcu::TestLog::Message)
      ;
      pMVar5 = tcu::MessageBuilder::operator<<
                         (&local_8f0,(char (*) [26])"Batched/Unbatched ratio: ");
      local_8f8 = (double)local_150 / batchedStats.standardErrorOfMean;
      pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&local_8f8);
      tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_8f0);
      this_00 = (this->super_TestCase).super_TestNode.m_testCtx;
      de::floatToString_abi_cxx11_
                (&local_918,(de *)&DAT_00000001,
                 (float)((double)local_150 / batchedStats.standardErrorOfMean),precision);
      pcVar4 = (char *)std::__cxx11::string::c_str();
      tcu::TestContext::setTestResult(this_00,QP_TEST_RESULT_PASS,pcVar4);
      std::__cxx11::string::~string((string *)&local_918);
      this_local._4_4_ = STOP;
      local_91c = 1;
    }
    else {
      if (0.02 < unbatchedStats.standardDeviation / batchedStats.standardErrorOfMean) {
        tcu::TestLog::operator<<
                  (&local_aa0,section.m_log,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar5 = tcu::MessageBuilder::operator<<
                           (&local_aa0,
                            (char (*) [51])"Unbatched standard error of mean outside of range.");
        tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_aa0);
      }
      if (0.02 < batchedStats.standardDeviation / (double)local_150) {
        tcu::TestLog::operator<<
                  ((MessageBuilder *)&x,section.m_log,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar5 = tcu::MessageBuilder::operator<<
                           ((MessageBuilder *)&x,
                            (char (*) [49])"Batched standard error of mean outside of range.");
        tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)&x);
      }
      if (unbatchedStats.mean <= 0.0) {
        sVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                          (&this->m_unbatchedSamplesUs);
        this->m_unbatchedSampleCount = (int)sVar2;
      }
      else {
        local_c28 = (unbatchedStats.mean / batchedStats.standardErrorOfMean) / 0.02;
        sVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                          (&this->m_unbatchedSamplesUs);
        x_1._4_4_ = (undefined4)sVar2;
        x_1._0_4_ = (int)(local_c28 * local_c28);
        piVar6 = std::max<int>((int *)((long)&x_1 + 4),(int *)&x_1);
        this->m_unbatchedSampleCount = *piVar6;
      }
      if (batchedStats.mean <= 0.0) {
        sVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                          (&this->m_batchedSamplesUs);
        this->m_batchedSampleCount = (int)sVar2;
      }
      else {
        local_c38 = (batchedStats.mean / (double)local_150) / 0.02;
        sVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                          (&this->m_batchedSamplesUs);
        local_c3c = (int)sVar2;
        local_c40 = (int)(local_c38 * local_c38);
        piVar6 = std::max<int>(&local_c3c,&local_c40);
        this->m_batchedSampleCount = *piVar6;
      }
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::clear(&this->m_batchedSamplesUs);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::clear(&this->m_unbatchedSamplesUs)
      ;
      this->m_sampleIteration = this->m_sampleIteration + 1;
      this->m_state = STATE_SAMPLE;
      local_91c = 0;
    }
    tcu::ScopedLogSection::~ScopedLogSection(&local_38);
    if (local_91c != 0) {
      return this_local._4_4_;
    }
  }
  return CONTINUE;
}

Assistant:

tcu::TestCase::IterateResult DrawCallBatchingTest::iterate (void)
{
	if (m_state == STATE_LOG_INFO)
	{
		logTestInfo();
		m_state = STATE_WARMUP_BATCHED;
	}
	else if (m_state == STATE_WARMUP_BATCHED)
	{
		renderBatched();
		m_state = STATE_WARMUP_UNBATCHED;
	}
	else if (m_state == STATE_WARMUP_UNBATCHED)
	{
		renderUnbatched();
		m_state = STATE_SAMPLE;
	}
	else if (m_state == STATE_SAMPLE)
	{
		if ((int)m_unbatchedSamplesUs.size() < m_unbatchedSampleCount && ((double)m_unbatchedSamplesUs.size() / ((double)m_unbatchedSampleCount) < (double)m_batchedSamplesUs.size() / ((double)m_batchedSampleCount) || (int)m_batchedSamplesUs.size() >= m_batchedSampleCount))
			m_unbatchedSamplesUs.push_back(renderUnbatched());
		else if ((int)m_batchedSamplesUs.size() < m_batchedSampleCount)
			m_batchedSamplesUs.push_back(renderBatched());
		else
			m_state = STATE_CALC_CALIBRATION;
	}
	else if (m_state == STATE_CALC_CALIBRATION)
	{
		TestLog& log = m_testCtx.getLog();

		tcu::ScopedLogSection	section(log, ("Sampling iteration " + de::toString(m_sampleIteration)).c_str(), ("Sampling iteration " + de::toString(m_sampleIteration)).c_str());
		const double targetSEM	= 0.02;
		const double limitSEM	= 0.025;

		Statistics unbatchedStats	= calculateStats(m_unbatchedSamplesUs);
		Statistics batchedStats		= calculateStats(m_batchedSamplesUs);

		log << TestLog::Message << "Batched samples; Count: " << m_batchedSamplesUs.size() << ", Mean: " << batchedStats.mean << "us, Standard deviation: " << batchedStats.standardDeviation << "us, Standard error of mean: " << batchedStats.standardErrorOfMean << "us(" << (batchedStats.standardErrorOfMean/batchedStats.mean) << ")" << TestLog::EndMessage;
		log << TestLog::Message << "Unbatched samples; Count: " << m_unbatchedSamplesUs.size() << ", Mean: " << unbatchedStats.mean << "us, Standard deviation: " << unbatchedStats.standardDeviation << "us, Standard error of mean: " << unbatchedStats.standardErrorOfMean << "us(" << (unbatchedStats.standardErrorOfMean/unbatchedStats.mean) << ")" << TestLog::EndMessage;

		if (m_sampleIteration > 2 || (m_sampleIteration > 0 && (unbatchedStats.standardErrorOfMean/unbatchedStats.mean) + (batchedStats.standardErrorOfMean/batchedStats.mean) <= 2.0 * limitSEM))
		{
			if (m_sampleIteration > 2)
				log << TestLog::Message << "Maximum iteration count reached." << TestLog::EndMessage;

			log << TestLog::Message << "Standard errors in target range." << TestLog::EndMessage;
			log << TestLog::Message << "Batched/Unbatched ratio: " << (batchedStats.mean / unbatchedStats.mean) << TestLog::EndMessage;

			m_testCtx.setTestResult(QP_TEST_RESULT_PASS, de::floatToString((float)(batchedStats.mean/unbatchedStats.mean), 1).c_str());
			return STOP;
		}
		else
		{
			if ((unbatchedStats.standardErrorOfMean/unbatchedStats.mean) > targetSEM)
				log << TestLog::Message << "Unbatched standard error of mean outside of range." << TestLog::EndMessage;

			if ((batchedStats.standardErrorOfMean/batchedStats.mean) > targetSEM)
				log << TestLog::Message << "Batched standard error of mean outside of range." << TestLog::EndMessage;

			if (unbatchedStats.standardDeviation > 0.0)
			{
				double x = (unbatchedStats.standardDeviation / unbatchedStats.mean) / targetSEM;
				m_unbatchedSampleCount = std::max((int)m_unbatchedSamplesUs.size(), (int)(x * x));
			}
			else
				m_unbatchedSampleCount = (int)m_unbatchedSamplesUs.size();

			if (batchedStats.standardDeviation > 0.0)
			{
				double x = (batchedStats.standardDeviation / batchedStats.mean) / targetSEM;
				m_batchedSampleCount = std::max((int)m_batchedSamplesUs.size(), (int)(x * x));
			}
			else
				m_batchedSampleCount = (int)m_batchedSamplesUs.size();

			m_batchedSamplesUs.clear();
			m_unbatchedSamplesUs.clear();

			m_sampleIteration++;
			m_state = STATE_SAMPLE;
		}
	}
	else
		DE_ASSERT(false);

	return CONTINUE;
}